

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitGetIterator(RegSlot iteratorReg,RegSlot iterableReg,ByteCodeGenerator *byteCodeGenerator,
                    FuncInfo *funcInfo)

{
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  RegSlot iterableReg_local;
  RegSlot iteratorReg_local;
  
  EmitGetObjectMethod(iteratorReg,iterableReg,0x14,byteCodeGenerator,funcInfo);
  EmitFunctionCall(iteratorReg,iteratorReg,iterableReg,byteCodeGenerator,funcInfo);
  EmitThrowOnNotObject(iteratorReg,byteCodeGenerator);
  return;
}

Assistant:

void EmitGetIterator(
    Js::RegSlot iteratorReg,
    Js::RegSlot iterableReg,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    EmitGetObjectMethod(
        iteratorReg,
        iterableReg,
        Js::PropertyIds::_symbolIterator,
        byteCodeGenerator,
        funcInfo);

    EmitFunctionCall(iteratorReg, iteratorReg, iterableReg, byteCodeGenerator, funcInfo);
    EmitThrowOnNotObject(iteratorReg, byteCodeGenerator);
}